

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::LoadLWO2PolygonTags(LWOImporter *this,uint length)

{
  uint16_t uVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  DeadlyImportError *this_00;
  size_type sVar5;
  Logger *this_01;
  reference pvVar6;
  uint j;
  uint i;
  uint32_t type;
  allocator<char> local_41;
  string local_40;
  uint8_t *local_20;
  uint8_t *end;
  LWOImporter *pLStack_10;
  uint length_local;
  LWOImporter *this_local;
  
  local_20 = this->mFileBuffer + length;
  end._4_4_ = length;
  pLStack_10 = this;
  if (3 < length) {
    uVar2 = GetU4(this);
    if ((uVar2 == 0x53555246) || (uVar2 == 0x534d4750)) {
      while (this->mFileBuffer < local_20) {
        iVar3 = ReadVSizedIntLWO2(this,&this->mFileBuffer);
        uVar4 = iVar3 + this->mCurLayer->mFaceIDXOfs;
        uVar1 = GetU2(this);
        sVar5 = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::size
                          (&this->mCurLayer->mFaces);
        if (uVar4 < sVar5) {
          if (uVar2 == 0x534d4750) {
            pvVar6 = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::operator[]
                               (&this->mCurLayer->mFaces,(ulong)uVar4);
            pvVar6->smoothGroup = (uint)uVar1;
          }
          else if (uVar2 == 0x53555246) {
            pvVar6 = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::operator[]
                               (&this->mCurLayer->mFaces,(ulong)uVar4);
            pvVar6->surfaceIndex = (uint)uVar1;
          }
        }
        else {
          this_01 = DefaultLogger::get();
          Logger::warn(this_01,"LWO2: face index in PTAG is out of range");
        }
      }
    }
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"LWO: PTAG chunk is too small",&local_41);
  DeadlyImportError::DeadlyImportError(this_00,&local_40);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void LWOImporter::LoadLWO2PolygonTags(unsigned int length)
{
    LE_NCONST uint8_t* const end = mFileBuffer+length;

    AI_LWO_VALIDATE_CHUNK_LENGTH(length,PTAG,4);
    uint32_t type = GetU4();

    if (type != AI_LWO_SURF && type != AI_LWO_SMGP)
        return;

    while (mFileBuffer < end)
    {
        unsigned int i = ReadVSizedIntLWO2(mFileBuffer) + mCurLayer->mFaceIDXOfs;
        unsigned int j = GetU2();

        if (i >= mCurLayer->mFaces.size())  {
            ASSIMP_LOG_WARN("LWO2: face index in PTAG is out of range");
            continue;
        }

        switch (type)   {

        case AI_LWO_SURF:
            mCurLayer->mFaces[i].surfaceIndex = j;
            break;
        case AI_LWO_SMGP: /* is that really used? */
            mCurLayer->mFaces[i].smoothGroup = j;
            break;
        };
    }
}